

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-birth.c
# Opt level: O2

void ui_enter_birthscreen(game_event_type type,game_event_data *data,void *user)

{
  void *pvVar1;
  player_race **pppVar2;
  player_class **pppVar3;
  wchar_t wVar4;
  long lVar5;
  wchar_t wVar6;
  
  quickstart_allowed = data->flag;
  pppVar2 = &races;
  wVar6 = L'\xffffffff';
  do {
    pppVar2 = &((player_race *)pppVar2)->next->next;
    wVar6 = wVar6 + L'\x01';
  } while ((player_race *)pppVar2 != (player_race *)0x0);
  if (player->race == (player_race *)0x0) {
    wVar4 = L'\0';
  }
  else {
    wVar4 = player->race->ridx;
  }
  init_birth_menu(&race_menu,wVar6,wVar4,&race_region,true,race_help);
  pvVar1 = race_menu.menu_data;
  pppVar2 = &races;
  while (pppVar2 = &((player_race *)pppVar2)->next->next,
        (player_race *)pppVar2 != (player_race *)0x0) {
    *(char **)(*pvVar1 + (ulong)((player_race *)pppVar2)->ridx * 8) = ((player_race *)pppVar2)->name
    ;
  }
  *(char **)((long)pvVar1 + 8) =
       "Race affects stats and skills, and may confer resistances and abilities.";
  pppVar3 = &classes;
  wVar6 = L'\xffffffff';
  do {
    pppVar3 = &((player_class *)pppVar3)->next->next;
    wVar6 = wVar6 + L'\x01';
  } while ((player_class *)pppVar3 != (player_class *)0x0);
  if (player->class == (player_class *)0x0) {
    wVar4 = L'\0';
  }
  else {
    wVar4 = player->class->cidx;
  }
  init_birth_menu(&class_menu,wVar6,wVar4,&class_region,true,class_help);
  pvVar1 = class_menu.menu_data;
  pppVar3 = &classes;
  while (pppVar3 = &((player_class *)pppVar3)->next->next,
        (player_class *)pppVar3 != (player_class *)0x0) {
    *(char **)(*pvVar1 + (ulong)((player_class *)pppVar3)->cidx * 8) =
         ((player_class *)pppVar3)->name;
  }
  *(char **)((long)pvVar1 + 8) = "Class affects stats, skills, and other character traits.";
  init_birth_menu(&roller_menu,L'\x02',L'\0',&roller_region,false,(browse_f)0x0);
  pvVar1 = roller_menu.menu_data;
  for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 4) {
    *(long *)(*pvVar1 + lVar5 * 2) =
         (long)&DAT_00261270 + (long)*(int *)((long)&DAT_00261270 + lVar5);
  }
  *(char **)((long)pvVar1 + 8) =
       "Choose how to generate your intrinsic stats. Point-based is recommended.";
  return;
}

Assistant:

static void ui_enter_birthscreen(game_event_type type, game_event_data *data,
								 void *user)
{
	/* Set the ugly static global that tells us if quickstart's available. */
	quickstart_allowed = data->flag;

	setup_menus();
}